

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_thread_create_ex(uv_thread_t *tid,uv_thread_options_t *params,_func_void_void_ptr *entry,
                       void *arg)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 __stacksize;
  pthread_attr_t *__attr;
  pthread_attr_t attr_storage;
  
  if (((params->flags & 1) == 0) || (sVar1 = params->stack_size, sVar1 == 0)) {
    iVar2 = getrlimit(RLIMIT_STACK,(rlimit *)&attr_storage);
    if (iVar2 != 0) goto LAB_0042cded;
    __stacksize = 0x200000;
    if (attr_storage.__align != -1) {
      iVar2 = getpagesize();
      uVar3 = attr_storage.__align - (ulong)attr_storage.__align % (ulong)(long)iVar2;
      attr_storage.__align = uVar3;
      if (0x1fff < uVar3) {
        uVar4 = __sysconf(0x4b);
        __stacksize = 0x200000;
        if (uVar4 <= uVar3) {
          __stacksize = attr_storage.__align;
        }
      }
    }
  }
  else {
    iVar2 = getpagesize();
    __stacksize = -(long)iVar2 & ((long)iVar2 + sVar1) - 1;
    uVar3 = __sysconf(0x4b);
    if ((ulong)__stacksize < uVar3) {
      __stacksize = __sysconf(0x4b);
    }
  }
  if (__stacksize != 0) {
    __attr = (pthread_attr_t *)&attr_storage;
    iVar2 = pthread_attr_init(__attr);
    if (iVar2 == 0) {
      iVar2 = pthread_attr_setstacksize(__attr,__stacksize);
      if (iVar2 == 0) goto LAB_0042cdf5;
    }
LAB_0042cded:
    abort();
  }
  __attr = (pthread_attr_t *)0x0;
LAB_0042cdf5:
  iVar2 = pthread_create(tid,__attr,(__start_routine *)entry,arg);
  if (__attr != (pthread_attr_t *)0x0) {
    pthread_attr_destroy(__attr);
  }
  return -iVar2;
}

Assistant:

int uv_thread_create_ex(uv_thread_t* tid,
                        const uv_thread_options_t* params,
                        void (*entry)(void *arg),
                        void *arg) {
  int err;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;
  size_t pagesize;
  size_t stack_size;

  stack_size =
      params->flags & UV_THREAD_HAS_STACK_SIZE ? params->stack_size : 0;

  attr = NULL;
  if (stack_size == 0) {
    stack_size = thread_stack_size();
  } else {
    pagesize = (size_t)getpagesize();
    /* Round up to the nearest page boundary. */
    stack_size = (stack_size + pagesize - 1) &~ (pagesize - 1);
#ifdef PTHREAD_STACK_MIN
    if (stack_size < PTHREAD_STACK_MIN)
      stack_size = PTHREAD_STACK_MIN;
#endif
  }

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  err = pthread_create(tid, attr, (void*(*)(void*)) entry, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}